

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_long_long lhs,
         SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  char cVar2;
  char in_SIL;
  unsigned_long_long in_RDI;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *unaff_retaddr;
  unsigned_long_long ret;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_00000016;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined7 in_stack_ffffffffffffffd8;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_11;
  unsigned_long_long local_10;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2;
  char local_1;
  
  local_10 = in_RDI;
  local_2.m_int = in_SIL;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_11);
  bVar1 = DivisionCornerCaseHelper<signed_char,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(ret,in_stack_00000016,unaff_retaddr);
  if (bVar1) {
    local_1 = local_11.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<signed_char,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2(local_10,local_2,&local_11);
    if (bVar1) {
      local_1 = local_11.m_int;
    }
    else {
      this = (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)0x0;
      cVar2 = SafeInt::operator_cast_to_signed_char
                        ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)0x0);
      DivisionHelper<unsigned_long_long,_signed_char,_1>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((unsigned_long_long *)this,(char *)CONCAT17(cVar2,in_stack_ffffffffffffffd8),
                 (unsigned_long_long *)0x157dbd);
      SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_long_long>
                (this,(unsigned_long_long *)CONCAT17(cVar2,in_stack_ffffffffffffffd8));
    }
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_1;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}